

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O0

void __thiscall Snake::UpdateHead(Snake *this)

{
  __type _Var1;
  Snake *this_local;
  
  switch(*(undefined4 *)this) {
  case 0:
    *(float *)(this + 0x14) = *(float *)(this + 0x14) - *(float *)(this + 4);
    break;
  case 1:
    *(float *)(this + 0x14) = *(float *)(this + 4) + *(float *)(this + 0x14);
    break;
  case 2:
    *(float *)(this + 0x10) = *(float *)(this + 0x10) - *(float *)(this + 4);
    break;
  case 3:
    *(float *)(this + 0x10) = *(float *)(this + 4) + *(float *)(this + 0x10);
  }
  _Var1 = std::fmod<float,int>
                    (*(float *)(this + 0x10) + (float)*(int *)(this + 0x34),*(int *)(this + 0x34));
  *(float *)(this + 0x10) = (float)_Var1;
  _Var1 = std::fmod<float,int>
                    (*(float *)(this + 0x14) + (float)*(int *)(this + 0x38),*(int *)(this + 0x38));
  *(float *)(this + 0x14) = (float)_Var1;
  return;
}

Assistant:

void Snake::UpdateHead() {
  switch (direction) {
    case Direction::kUp:
      head_y -= speed;
      break;

    case Direction::kDown:
      head_y += speed;
      break;

    case Direction::kLeft:
      head_x -= speed;
      break;

    case Direction::kRight:
      head_x += speed;
      break;
  }

  // Wrap the Snake around to the beginning if going off of the screen.
  head_x = fmod(head_x + grid_width, grid_width);
  head_y = fmod(head_y + grid_height, grid_height);
}